

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void Tokenizer::trim(string *string)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_30 = 0;
  local_28[0] = 0;
  __first._M_current = (string->_M_dataplus)._M_p;
  local_38 = local_28;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + string->_M_string_length),&WHITESPACE_REGEX_abi_cxx11_,"$1",2,0
            );
  std::__cxx11::string::operator=((string *)string,(string *)&local_38);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void Tokenizer::trim(std::string& string)
{
	string = std::regex_replace(string, WHITESPACE_REGEX, "$1");
}